

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O1

ImageViewWrapper * __thiscall
Diligent::TextureVkImpl::CreateImageView
          (ImageViewWrapper *__return_storage_ptr__,TextureVkImpl *this,TextureViewDesc *ViewDesc)

{
  TEXTURE_COMPONENT_SWIZZLE TVar1;
  COMPONENT_TYPE CVar2;
  SHADING_RATE_TEXTURE_ACCESS SVar3;
  BIND_FLAGS BindFlags;
  char *pcVar4;
  RenderDeviceVkImpl *pRVar5;
  VulkanLogicalDevice *this_00;
  TEXTURE_FORMAT TextureFormat;
  uint uVar6;
  TextureFormatAttribs *pTVar7;
  ulong uVar8;
  string ViewName;
  string msg;
  Uint32 local_48;
  Uint32 MipDepth;
  ImageViewWrapper *local_40;
  Uint32 local_34;
  
  if (5 < (byte)(ViewDesc->ViewType - TEXTURE_VIEW_SHADER_RESOURCE)) {
    FormatString<char[21]>(&msg,(char (*) [21])"Unexpected view type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateImageView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x2eb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (ViewDesc->Format == TEX_FORMAT_UNKNOWN) {
    ViewDesc->Format =
         (this->super_TextureBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
         .m_Desc.Format;
  }
  msg._M_dataplus._M_p = (pointer)0xf;
  msg._M_string_length = 0;
  msg.field_2._M_allocated_capacity = 0;
  msg.field_2._8_8_ = (this->m_VulkanImage).m_VkObject;
  switch(ViewDesc->TextureDim) {
  case RESOURCE_DIM_TEX_1D:
    break;
  case RESOURCE_DIM_TEX_1D_ARRAY:
    break;
  case RESOURCE_DIM_TEX_2D:
    break;
  case RESOURCE_DIM_TEX_2D_ARRAY:
switchD_0024655b_caseD_5:
    break;
  case RESOURCE_DIM_TEX_3D:
    if ((byte)(ViewDesc->ViewType - TEXTURE_VIEW_RENDER_TARGET) < 3) {
      if ((((this->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           .m_pDevice)->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.Texture.
          TextureView2DOn3DSupported == false) {
        FormatString<char[26],char[63]>
                  (&ViewName,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pDevice->GetAdapterInfo().Texture.TextureView2DOn3DSupported",
                   (char (*) [63])&switchD_0024655b::switchdataD_00812bf0);
        DebugAssertionFailed
                  (ViewName._M_dataplus._M_p,"CreateImageView",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                   ,0x310);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ViewName._M_dataplus._M_p != &ViewName.field_2) {
          operator_delete(ViewName._M_dataplus._M_p,ViewName.field_2._M_allocated_capacity + 1);
        }
      }
      if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Usage == USAGE_SPARSE) {
        FormatString<char[54]>
                  (&ViewName,(char (*) [54])"Can not create 2D texture view on a 3D sparse texture")
        ;
        DebugAssertionFailed
                  (ViewName._M_dataplus._M_p,"CreateImageView",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                   ,0x311);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ViewName._M_dataplus._M_p != &ViewName.field_2) {
          operator_delete(ViewName._M_dataplus._M_p,ViewName.field_2._M_allocated_capacity + 1);
        }
      }
      ViewDesc->TextureDim = RESOURCE_DIM_TEX_2D_ARRAY;
      goto switchD_0024655b_caseD_5;
    }
    uVar6 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc.field_3.ArraySize >> ((byte)ViewDesc->MostDetailedMip & 0x1f);
    MipDepth = uVar6 + (uVar6 == 0);
    if (((ViewDesc->field_5).FirstArraySlice != 0) ||
       ((ViewDesc->field_6).NumArraySlices != MipDepth)) {
      pcVar4 = (ViewDesc->super_DeviceObjectAttribs).Name;
      ViewName._M_dataplus._M_p = "";
      if (pcVar4 != (char *)0x0) {
        ViewName._M_dataplus._M_p = pcVar4;
      }
      local_34 = ViewDesc->NumMipLevels;
      local_48 = ViewDesc->MostDetailedMip;
      LogError<false,char[18],char_const*,char[23],unsigned_int,char[15],unsigned_int,char[16],unsigned_int,char[21],unsigned_int,char[15],char_const*,char[41],unsigned_int,char[78]>
                (false,"CreateImageView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,800,(char (*) [18])"3D texture view \'",(char **)&ViewName,
                 (char (*) [23])"\' (most detailed mip: ",&local_48,(char (*) [15])"; mip levels: ",
                 &local_34,(char (*) [16])"; first slice: ",&(ViewDesc->field_5).FirstArraySlice,
                 (char (*) [21])"; num depth slices: ",&(ViewDesc->field_6).NumArraySlices,
                 (char (*) [15])") of texture \'",
                 (char **)&(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                           .m_Desc,(char (*) [41])"\' does not references all depth slices (",
                 &MipDepth,
                 (char (*) [78])
                 ") in the mip level. 3D texture views in Vulkan must address all depth slices.");
      (ViewDesc->field_5).FirstArraySlice = 0;
      (ViewDesc->field_6).NumArraySlices = MipDepth;
    }
    break;
  case RESOURCE_DIM_TEX_CUBE:
    break;
  case RESOURCE_DIM_TEX_CUBE_ARRAY:
    break;
  default:
    FormatString<char[26]>(&ViewName,(char (*) [26])"Unexpected view dimension");
    DebugAssertionFailed
              (ViewName._M_dataplus._M_p,"CreateImageView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x32f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ViewName._M_dataplus._M_p != &ViewName.field_2) {
      operator_delete(ViewName._M_dataplus._M_p,ViewName.field_2._M_allocated_capacity + 1);
    }
  }
  TextureFormat = ViewDesc->Format;
  BindFlags = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
              .m_Desc.BindFlags;
  if ((BindFlags & BIND_DEPTH_STENCIL) != BIND_NONE) {
    TextureFormat = GetDefaultTextureViewFormat(TextureFormat,TEXTURE_VIEW_DEPTH_STENCIL,BindFlags);
  }
  TexFormatToVkFormat(TextureFormat);
  if (ViewDesc->Format == TEX_FORMAT_A8_UNORM) {
    TVar1 = (ViewDesc->Swizzle).R;
    if ((byte)(TVar1 - TEXTURE_COMPONENT_SWIZZLE_ZERO) < 2) {
      TextureComponentSwizzleToVkComponentSwizzle(TVar1);
    }
    TVar1 = (ViewDesc->Swizzle).G;
    local_40 = __return_storage_ptr__;
    if ((byte)(TVar1 - TEXTURE_COMPONENT_SWIZZLE_ZERO) < 2) {
      TextureComponentSwizzleToVkComponentSwizzle(TVar1);
    }
    TVar1 = (ViewDesc->Swizzle).B;
    if ((byte)(TVar1 - TEXTURE_COMPONENT_SWIZZLE_ZERO) < 2) {
      TextureComponentSwizzleToVkComponentSwizzle(TVar1);
    }
    TVar1 = (ViewDesc->Swizzle).A;
    __return_storage_ptr__ = local_40;
    if ((byte)(TVar1 - TEXTURE_COMPONENT_SWIZZLE_ZERO) < 2) {
      TextureComponentSwizzleToVkComponentSwizzle(TVar1);
      __return_storage_ptr__ = local_40;
    }
  }
  else {
    TextureComponentMappingToVkComponentMapping(&ViewDesc->Swizzle);
  }
  pTVar7 = GetTextureFormatAttribs(TextureFormat);
  CVar2 = pTVar7->ComponentType;
  if ((byte)(ViewDesc->ViewType - TEXTURE_VIEW_DEPTH_STENCIL) < 2) {
    if ((CVar2 == COMPONENT_TYPE_DEPTH_STENCIL) || (CVar2 == COMPONENT_TYPE_DEPTH))
    goto LAB_002469ee;
    FormatString<char[58]>
              (&ViewName,(char (*) [58])"Unexpected component type for a depth-stencil view format")
    ;
    DebugAssertionFailed
              (ViewName._M_dataplus._M_p,"CreateImageView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x366);
  }
  else {
    if ((CVar2 != COMPONENT_TYPE_DEPTH_STENCIL) ||
       ((uVar8 = (ulong)ViewDesc->Format, uVar8 < 0x30 &&
        ((((0x200000100000U >> (uVar8 & 0x3f) & 1) != 0 ||
          ((0x400000200000U >> (uVar8 & 0x3f) & 1) != 0)) ||
         ((0x800000400000U >> (uVar8 & 0x3f) & 1) != 0)))))) goto LAB_002469ee;
    FormatString<char[40]>(&ViewName,(char (*) [40])"Unexpected depth-stencil texture format");
    DebugAssertionFailed
              (ViewName._M_dataplus._M_p,"CreateImageView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x382);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ViewName._M_dataplus._M_p != &ViewName.field_2) {
    operator_delete(ViewName._M_dataplus._M_p,ViewName.field_2._M_allocated_capacity + 1);
  }
LAB_002469ee:
  pRVar5 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           .m_pDevice;
  this_00 = (pRVar5->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (((ViewDesc->ViewType == TEXTURE_VIEW_SHADING_RATE) &&
      ((this_00->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap != 0)) &&
     (SVar3 = (pRVar5->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate.
              ShadingRateTextureAccess, SVar3 != SHADING_RATE_TEXTURE_ACCESS_ON_SET_RTV)) {
    if (SVar3 == SHADING_RATE_TEXTURE_ACCESS_ON_SUBMIT) {
      msg.field_2._M_allocated_capacity = msg.field_2._M_allocated_capacity | 2;
    }
    else if (SVar3 == SHADING_RATE_TEXTURE_ACCESS_ON_GPU) {
      msg.field_2._M_allocated_capacity = msg.field_2._M_allocated_capacity | 1;
    }
    else {
      FormatString<char[36]>(&ViewName,(char (*) [36])"Unexpected shading rate access type");
      DebugAssertionFailed
                (ViewName._M_dataplus._M_p,"CreateImageView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x39d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ViewName._M_dataplus._M_p != &ViewName.field_2) {
        operator_delete(ViewName._M_dataplus._M_p,ViewName.field_2._M_allocated_capacity + 1);
      }
    }
  }
  ViewName._M_dataplus._M_p = (pointer)&ViewName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ViewName,"Image view for \'","");
  std::__cxx11::string::append((char *)&ViewName);
  std::__cxx11::string::push_back((char)&ViewName);
  VulkanUtilities::VulkanLogicalDevice::CreateImageView
            (__return_storage_ptr__,this_00,(VkImageViewCreateInfo *)&msg,ViewName._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ViewName._M_dataplus._M_p != &ViewName.field_2) {
    operator_delete(ViewName._M_dataplus._M_p,ViewName.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

VulkanUtilities::ImageViewWrapper TextureVkImpl::CreateImageView(TextureViewDesc& ViewDesc)
{
    // clang-format off
    VERIFY(ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE ||
           ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET ||
           ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL ||
           ViewDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL ||
           ViewDesc.ViewType == TEXTURE_VIEW_UNORDERED_ACCESS ||
           ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE,
           "Unexpected view type");
    // clang-format on
    if (ViewDesc.Format == TEX_FORMAT_UNKNOWN)
    {
        ViewDesc.Format = m_Desc.Format;
    }

    VkImageViewCreateInfo ImageViewCI = {};

    ImageViewCI.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
    ImageViewCI.pNext = nullptr;
    ImageViewCI.flags = 0; // reserved for future use.
    ImageViewCI.image = m_VulkanImage;

    switch (ViewDesc.TextureDim)
    {
        case RESOURCE_DIM_TEX_1D:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_1D;
            break;

        case RESOURCE_DIM_TEX_1D_ARRAY:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_1D_ARRAY;
            break;

        case RESOURCE_DIM_TEX_2D:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_2D;
            break;

        case RESOURCE_DIM_TEX_2D_ARRAY:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
            break;

        case RESOURCE_DIM_TEX_3D:
            if (ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET ||
                ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL ||
                ViewDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
            {
                VERIFY_EXPR(m_pDevice->GetAdapterInfo().Texture.TextureView2DOn3DSupported);
                VERIFY(m_Desc.Usage != USAGE_SPARSE, "Can not create 2D texture view on a 3D sparse texture");

                ViewDesc.TextureDim  = RESOURCE_DIM_TEX_2D_ARRAY;
                ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
            }
            else
            {
                ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_3D;
                Uint32 MipDepth      = std::max(m_Desc.Depth >> ViewDesc.MostDetailedMip, 1U);
                if (ViewDesc.FirstDepthSlice != 0 || ViewDesc.NumDepthSlices != MipDepth)
                {
                    LOG_ERROR("3D texture view '", (ViewDesc.Name ? ViewDesc.Name : ""), "' (most detailed mip: ", Uint32{ViewDesc.MostDetailedMip},
                              "; mip levels: ", Uint32{ViewDesc.NumMipLevels}, "; first slice: ", ViewDesc.FirstDepthSlice,
                              "; num depth slices: ", ViewDesc.NumDepthSlices, ") of texture '", m_Desc.Name,
                              "' does not references all depth slices (", MipDepth,
                              ") in the mip level. 3D texture views in Vulkan must address all depth slices.");
                    ViewDesc.FirstDepthSlice = 0;
                    ViewDesc.NumDepthSlices  = MipDepth;
                }
            }
            break;

        case RESOURCE_DIM_TEX_CUBE:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_CUBE;
            break;

        case RESOURCE_DIM_TEX_CUBE_ARRAY:
            ImageViewCI.viewType = VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
            break;

        default: UNEXPECTED("Unexpected view dimension");
    }

    TEXTURE_FORMAT CorrectedViewFormat = ViewDesc.Format;
    if (m_Desc.BindFlags & BIND_DEPTH_STENCIL)
        CorrectedViewFormat = GetDefaultTextureViewFormat(CorrectedViewFormat, TEXTURE_VIEW_DEPTH_STENCIL, m_Desc.BindFlags);
    ImageViewCI.format = TexFormatToVkFormat(CorrectedViewFormat);
    if (ViewDesc.Format == TEX_FORMAT_A8_UNORM)
    {
        auto GetA8Swizzle = [](TEXTURE_COMPONENT_SWIZZLE Component, TEXTURE_COMPONENT_SWIZZLE Swizzle) {
            if (Swizzle == TEXTURE_COMPONENT_SWIZZLE_ZERO || Swizzle == TEXTURE_COMPONENT_SWIZZLE_ONE)
                return TextureComponentSwizzleToVkComponentSwizzle(Swizzle);

            if (Swizzle == TEXTURE_COMPONENT_SWIZZLE_A || (Component == TEXTURE_COMPONENT_SWIZZLE_A && Swizzle == TEXTURE_COMPONENT_SWIZZLE_IDENTITY))
                return VK_COMPONENT_SWIZZLE_R;

            return VK_COMPONENT_SWIZZLE_ZERO;
        };

        ImageViewCI.components = {
            GetA8Swizzle(TEXTURE_COMPONENT_SWIZZLE_R, ViewDesc.Swizzle.R),
            GetA8Swizzle(TEXTURE_COMPONENT_SWIZZLE_G, ViewDesc.Swizzle.G),
            GetA8Swizzle(TEXTURE_COMPONENT_SWIZZLE_B, ViewDesc.Swizzle.B),
            GetA8Swizzle(TEXTURE_COMPONENT_SWIZZLE_A, ViewDesc.Swizzle.A) //
        };
    }
    else
    {
        ImageViewCI.components = TextureComponentMappingToVkComponentMapping(ViewDesc.Swizzle);
    }

    ImageViewCI.subresourceRange.baseMipLevel = ViewDesc.MostDetailedMip;
    ImageViewCI.subresourceRange.levelCount   = ViewDesc.NumMipLevels;
    if (m_Desc.IsArray())
    {
        ImageViewCI.subresourceRange.baseArrayLayer = ViewDesc.FirstArraySlice;
        ImageViewCI.subresourceRange.layerCount     = ViewDesc.NumArraySlices;
    }
    else
    {
        ImageViewCI.subresourceRange.baseArrayLayer = 0;
        ImageViewCI.subresourceRange.layerCount     = 1;
    }

    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(CorrectedViewFormat);

    if (ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
    {
        // When an imageView of a depth/stencil image is used as a depth/stencil framebuffer attachment,
        // the aspectMask is ignored and both depth and stencil image subresources are used. (11.5)
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH)
            ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
        else if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
            ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
        else
            UNEXPECTED("Unexpected component type for a depth-stencil view format");
    }
    else
    {
        // aspectMask must be only VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_ASPECT_DEPTH_BIT or VK_IMAGE_ASPECT_STENCIL_BIT
        // if format is a color, depth-only or stencil-only format, respectively.  (11.5)
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH)
        {
            ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
        }
        else if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            if (ViewDesc.Format == TEX_FORMAT_D32_FLOAT_S8X24_UINT ||
                ViewDesc.Format == TEX_FORMAT_D24_UNORM_S8_UINT)
            {
                ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
            }
            else if (ViewDesc.Format == TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS ||
                     ViewDesc.Format == TEX_FORMAT_R24_UNORM_X8_TYPELESS)
            {
                ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
            }
            else if (ViewDesc.Format == TEX_FORMAT_X32_TYPELESS_G8X24_UINT ||
                     ViewDesc.Format == TEX_FORMAT_X24_TYPELESS_G8_UINT)
            {
                ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_STENCIL_BIT;
            }
            else
                UNEXPECTED("Unexpected depth-stencil texture format");
        }
        else
            ImageViewCI.subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    }

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

    if (ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE)
    {
        if (LogicalDevice.GetEnabledExtFeatures().FragmentDensityMap.fragmentDensityMap != VK_FALSE)
        {
            const SHADING_RATE_TEXTURE_ACCESS ShadingRateTexAccess = m_pDevice->GetAdapterInfo().ShadingRate.ShadingRateTextureAccess;
            switch (ShadingRateTexAccess)
            {
                case SHADING_RATE_TEXTURE_ACCESS_ON_GPU:
                    ImageViewCI.flags |= VK_IMAGE_VIEW_CREATE_FRAGMENT_DENSITY_MAP_DYNAMIC_BIT_EXT;
                    break;

                case SHADING_RATE_TEXTURE_ACCESS_ON_SUBMIT:
                    ImageViewCI.flags |= VK_IMAGE_VIEW_CREATE_FRAGMENT_DENSITY_MAP_DEFERRED_BIT_EXT;
                    break;

                case SHADING_RATE_TEXTURE_ACCESS_ON_SET_RTV:
                    break;

                default:
                    UNEXPECTED("Unexpected shading rate access type");
            }
        }
    }

    std::string ViewName = "Image view for \'";
    ViewName += m_Desc.Name;
    ViewName += '\'';
    return LogicalDevice.CreateImageView(ImageViewCI, ViewName.c_str());
}